

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontStructMatrix.cpp
# Opt level: O2

void __thiscall
TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOT<double>_>::
AdjustSequenceNumbering
          (TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOT<double>_> *this)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  TPZCompEl *pTVar3;
  TPZCompMesh *this_00;
  TPZCompEl **ppTVar4;
  TPZConnect *pTVar5;
  _Base_ptr p_Var6;
  ostream *poVar7;
  long lVar8;
  long lVar9;
  long nelem;
  _Self __tmp;
  int64_t size;
  long lVar10;
  set<long,_std::less<long>,_std::allocator<long>_> indepconnects;
  set<long,_std::less<long>,_std::allocator<long>_> depconnects;
  TPZManVector<long,_10> permute;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_100;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_d0;
  TPZManVector<long,_10> local_a0;
  
  size = (((this->super_TPZStructMatrixT<double>).super_TPZStructMatrix.fMesh)->fConnectVec).
         super_TPZChunkVector<TPZConnect,_10>.fNElements;
  TPZManVector<long,_10>::TPZManVector(&local_a0,size);
  (**(code **)(*(long *)(this->super_TPZStructMatrixT<double>).super_TPZStructMatrix.fMesh + 0x78))
            ();
  lVar8 = 0;
  if (size < 1) {
    size = lVar8;
  }
  for (; size != lVar8; lVar8 = lVar8 + 1) {
    local_a0.super_TPZVec<long>.fStore[lVar8] = lVar8;
  }
  lVar8 = (this->fElementOrder).fNElements;
  p_Var1 = &local_100._M_impl.super__Rb_tree_header;
  lVar9 = 0;
  if (lVar8 < 1) {
    lVar8 = lVar9;
  }
  for (lVar10 = 0; lVar10 != lVar8; lVar10 = lVar10 + 1) {
    nelem = (long)(this->fElementOrder).fStore[lVar10];
    if (-1 < nelem) {
      ppTVar4 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                          (&(((this->super_TPZStructMatrixT<double>).super_TPZStructMatrix.fMesh)->
                            fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>,nelem);
      pTVar3 = *ppTVar4;
      if (pTVar3 != (TPZCompEl *)0x0) {
        local_100._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_100._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_100._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_d0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_d0._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_d0._M_impl.super__Rb_tree_header._M_header;
        local_d0._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_100._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
        local_100._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
        local_d0._M_impl.super__Rb_tree_header._M_header._M_right =
             local_d0._M_impl.super__Rb_tree_header._M_header._M_left;
        (**(code **)(*(long *)pTVar3 + 0x1d8))(pTVar3,&local_100,&local_d0);
        for (p_Var6 = local_100._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var6 != p_Var1; p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)
            ) {
          pTVar5 = TPZChunkVector<TPZConnect,_10>::operator[]
                             (&(((this->super_TPZStructMatrixT<double>).super_TPZStructMatrix.fMesh)
                               ->fConnectVec).super_TPZChunkVector<TPZConnect,_10>,
                              *(int64_t *)(p_Var6 + 1));
          iVar2 = pTVar5->fNElConnected;
          if (iVar2 == 1) {
            local_a0.super_TPZVec<long>.fStore[pTVar5->fSequenceNumber] = lVar9;
            lVar9 = lVar9 + 1;
          }
          pTVar5->fNElConnected = iVar2 + -1;
        }
        std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
        ~_Rb_tree(&local_d0);
        std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
        ~_Rb_tree(&local_100);
      }
    }
  }
  lVar8 = 0;
  while( true ) {
    this_00 = (this->super_TPZStructMatrixT<double>).super_TPZStructMatrix.fMesh;
    if (size == lVar8) {
      TPZCompMesh::Permute(this_00,&local_a0.super_TPZVec<long>);
      TPZManVector<long,_10>::~TPZManVector(&local_a0);
      return;
    }
    pTVar5 = TPZChunkVector<TPZConnect,_10>::operator[]
                       (&(this_00->fConnectVec).super_TPZChunkVector<TPZConnect,_10>,lVar8);
    if (((-1 < pTVar5->fSequenceNumber) && (0 < pTVar5->fNElConnected)) &&
       (local_a0.super_TPZVec<long>.fStore[pTVar5->fSequenceNumber] < lVar9)) break;
    lVar8 = lVar8 + 1;
  }
  poVar7 = std::operator<<((ostream *)&std::cout,
                           "void TPZFrontStructMatrix<TPZFrontNonSym<double>, double, TPZStructMatrixOT<STATE>>::AdjustSequenceNumbering() [TFront = TPZFrontNonSym<double>, TVar = double, TPar = TPZStructMatrixOT<STATE>]"
                          );
  std::operator<<(poVar7," very fishy\n");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/StrMatrix/TPZFrontStructMatrix.cpp"
             ,0x1f5);
}

Assistant:

void TPZFrontStructMatrix<TFront,TVar,TPar>::AdjustSequenceNumbering()
{
	int64_t nconnect = this->fMesh->ConnectVec().NElements();
	TPZManVector<int64_t> permute(nconnect);
	this->fMesh->ComputeNodElCon();
	int64_t i;
	for(i=0; i<nconnect; i++)
	{
		permute[i] = i;
	}
	TPZCompEl *cel;
	int64_t nelem = fElementOrder.NElements();
	int64_t el;
	int64_t connectcount = 0;
	for(i=0; i<nelem; i++)
	{
		el = fElementOrder[i];
        if(el<0) continue;
		cel = this->fMesh->ElementVec()[el];
		if(!cel) continue;
		std::set<int64_t> indepconnects, depconnects;
		cel->BuildConnectList(indepconnects,depconnects);
		std::set<int64_t>::iterator it;
		for(it=indepconnects.begin(); it != indepconnects.end(); it++)
		{
			TPZConnect &nod = this->fMesh->ConnectVec()[*it];
			int nelcon = nod.NElConnected()-1;
			int64_t seqnum = nod.SequenceNumber();
			if(nelcon == 0) permute[seqnum]= connectcount++;
			nod.DecrementElConnected();
		}
	}
	for(i=0; i<nconnect; i++)
	{
		TPZConnect &nod = this->fMesh->ConnectVec()[i];
		if(nod.SequenceNumber() < 0 || nod.NElConnected() <= 0) continue;
		if(permute[nod.SequenceNumber()] < connectcount)
		{
			std::cout << __PRETTY_FUNCTION__ << " very fishy\n";
			DebugStop();
		}
	}
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
	{
		std::stringstream sout;
		sout << __PRETTY_FUNCTION__ << " permutation " << permute;
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	this->fMesh->Permute(permute);
}